

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O0

pointer __thiscall
tcmalloc::STLPageHeapAllocator<std::_Rb_tree_node<tcmalloc::SpanPtrWithLength>,_void>::allocate
          (STLPageHeapAllocator<std::_Rb_tree_node<tcmalloc::SpanPtrWithLength>,_void> *this,
          size_type n,void *param_2)

{
  LogItem b;
  LogItem c;
  LogItem d;
  _Rb_tree_node<tcmalloc::SpanPtrWithLength> *p_Var1;
  LogItem a;
  LogItem local_60;
  LogItem local_50;
  LogItem local_40;
  LogItem local_30;
  void *local_20;
  void *param_2_local;
  size_type n_local;
  STLPageHeapAllocator<std::_Rb_tree_node<tcmalloc::SpanPtrWithLength>,_void> *this_local;
  
  local_20 = param_2;
  param_2_local = (void *)n;
  n_local = (size_type)this;
  if (!underlying_.initialized) {
    PageHeapAllocator<std::_Rb_tree_node<tcmalloc::SpanPtrWithLength>_>::Init
              (&underlying_.allocator);
    underlying_.initialized = true;
  }
  if (param_2_local != (void *)0x1) {
    LogItem::LogItem(&local_30,"n == 1");
    LogItem::LogItem(&local_40);
    LogItem::LogItem(&local_50);
    LogItem::LogItem(&local_60);
    a._4_4_ = 0;
    a.tag_ = local_30.tag_;
    b.u_.str = local_40.u_.str;
    b.tag_ = local_40.tag_;
    b._4_4_ = local_40._4_4_;
    c.u_.str = local_50.u_.str;
    c.tag_ = local_50.tag_;
    c._4_4_ = local_50._4_4_;
    d.u_.str = local_60.u_.str;
    d.tag_ = local_60.tag_;
    d._4_4_ = local_60._4_4_;
    a.u_.str = local_30.u_.str;
    Log(kCrash,
        "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap_allocator.h"
        ,0xa2,a,b,c,d);
    do {
    } while( true );
  }
  p_Var1 = PageHeapAllocator<std::_Rb_tree_node<tcmalloc::SpanPtrWithLength>_>::New
                     (&underlying_.allocator);
  return p_Var1;
}

Assistant:

pointer allocate(size_type n, const void* = 0) {
    if (!underlying_.initialized) {
      underlying_.allocator.Init();
      underlying_.initialized = true;
    }

    CHECK_CONDITION(n == 1);
    return underlying_.allocator.New();
  }